

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

bool __thiscall QAccessibleTree::selectRow(QAccessibleTree *this,int row)

{
  QAccessibleObject *pQVar1;
  char cVar2;
  SelectionBehavior SVar3;
  SelectionMode SVar4;
  int iVar5;
  QAbstractItemView *pQVar6;
  QItemSelectionModel *pQVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QModelIndex QStack_78;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &(this->super_QAccessibleTable).super_QAccessibleObject;
  (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))(pQVar1);
  pQVar6 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar7 = QAbstractItemView::selectionModel(pQVar6);
  if (pQVar7 != (QItemSelectionModel *)0x0) {
    local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    indexFromLogical(&local_48,this,row,0);
    bVar8 = false;
    if (((local_48.r < 0) || (bVar8 = false, (long)local_48._0_8_ < 0)) ||
       (local_48.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0052a92b;
    (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    pQVar6 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject)
    ;
    SVar3 = QAbstractItemView::selectionBehavior(pQVar6);
    if (SVar3 != SelectColumns) {
      (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
      pQVar6 = (QAbstractItemView *)
               QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      SVar4 = QAbstractItemView::selectionMode(pQVar6);
      if (SVar4 != NoSelection) {
        if (SVar4 == ContiguousSelection) {
          if (row != 0) {
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            pQVar6 = (QAbstractItemView *)
                     QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
            pQVar7 = QAbstractItemView::selectionModel(pQVar6);
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            pQVar6 = (QAbstractItemView *)
                     QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
            QAbstractItemView::rootIndex(&local_60,pQVar6);
            cVar2 = QItemSelectionModel::isRowSelected((int)pQVar7,(QModelIndex *)(ulong)(row - 1));
            if (cVar2 != '\0') goto LAB_0052aaa1;
          }
          (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
          pQVar6 = (QAbstractItemView *)
                   QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
          pQVar7 = QAbstractItemView::selectionModel(pQVar6);
          (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
          pQVar6 = (QAbstractItemView *)
                   QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
          QAbstractItemView::rootIndex(&QStack_78,pQVar6);
          cVar2 = QItemSelectionModel::isRowSelected((int)pQVar7,(QModelIndex *)(ulong)(row + 1));
          if (cVar2 == '\0') {
LAB_0052aa81:
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            pQVar6 = (QAbstractItemView *)
                     QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
            QAbstractItemView::clearSelection(pQVar6);
          }
        }
        else if (SVar4 == SingleSelection) {
          (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
          pQVar6 = (QAbstractItemView *)
                   QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
          SVar3 = QAbstractItemView::selectionBehavior(pQVar6);
          if ((SVar3 == SelectRows) ||
             (iVar5 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this), iVar5 < 2)
             ) goto LAB_0052aa81;
          goto LAB_0052a929;
        }
LAB_0052aaa1:
        (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
        pQVar6 = (QAbstractItemView *)
                 QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
        pQVar7 = QAbstractItemView::selectionModel(pQVar6);
        (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,&local_48,0x22);
        bVar8 = true;
        goto LAB_0052a92b;
      }
    }
  }
LAB_0052a929:
  bVar8 = false;
LAB_0052a92b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QAccessibleTree::selectRow(int row)
{
    if (!view()->selectionModel())
        return false;
    QModelIndex index = indexFromLogical(row);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if ((view()->selectionBehavior() != QAbstractItemView::SelectRows) && (columnCount() > 1))
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !view()->selectionModel()->isRowSelected(row - 1, view()->rootIndex()))
            && !view()->selectionModel()->isRowSelected(row + 1, view()->rootIndex()))
            view()->clearSelection();
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}